

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O0

void __thiscall
wasm::MultiMemoryLowering::Replacer::visitAtomicWait(Replacer *this,AtomicWait *curr)

{
  BasicType BVar1;
  Expression *pEVar2;
  Index local_1c;
  Index bytes;
  AtomicWait *curr_local;
  Replacer *this_local;
  
  BVar1 = wasm::Type::getBasic(&curr->expectedType);
  if (BVar1 == i32) {
    local_1c = 4;
  }
  else {
    if (BVar1 != i64) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MultiMemoryLowering.cpp"
                         ,0x170);
    }
    local_1c = 8;
  }
  pEVar2 = getPtr<wasm::AtomicWait>(this,curr,local_1c);
  curr->ptr = pEVar2;
  setMemory<wasm::AtomicWait>(this,curr);
  return;
}

Assistant:

void visitAtomicWait(AtomicWait* curr) {
      Index bytes;
      switch (curr->expectedType.getBasic()) {
        case Type::i32: {
          bytes = 4;
          break;
        }
        case Type::i64: {
          bytes = 8;
          break;
        }
        default:
          WASM_UNREACHABLE("unexpected type");
      }
      curr->ptr = getPtr(curr, bytes);
      setMemory(curr);
    }